

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

ErrorData * __thiscall
duckdb::LocalTableStorage::AppendToIndexes
          (ErrorData *__return_storage_ptr__,LocalTableStorage *this,DuckTransaction *transaction,
          RowGroupCollection *source,TableIndexList *index_list,
          vector<duckdb::LogicalType,_true> *table_types,row_t *start_row)

{
  __node_base *p_Var1;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  vector<duckdb::StorageIndex,_true> required_columns;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  index_columns;
  DataChunk mock_chunk;
  
  TableIndexList::GetRequiredColumns(&index_columns,index_list);
  required_columns.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  required_columns.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  required_columns.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &index_columns._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
    emplace_back<unsigned_long_const&>
              ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)
               &required_columns,(unsigned_long *)(p_Var1 + 1));
  }
  DataChunk::DataChunk(&mock_chunk);
  DataChunk::InitializeEmpty(&mock_chunk,table_types);
  ErrorData::ErrorData(__return_storage_ptr__);
  local_d8 = (code *)0x0;
  pcStack_d0 = (code *)0x0;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_e8._M_unused._M_object = operator_new(0x30);
  *(vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> **)local_e8._M_unused._0_8_ =
       (vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&required_columns;
  *(DataChunk **)((long)local_e8._M_unused._0_8_ + 8) = &mock_chunk;
  *(ErrorData **)((long)local_e8._M_unused._0_8_ + 0x10) = __return_storage_ptr__;
  *(TableIndexList **)((long)local_e8._M_unused._0_8_ + 0x18) = index_list;
  *(LocalTableStorage **)((long)local_e8._M_unused._0_8_ + 0x20) = this;
  *(row_t **)((long)local_e8._M_unused._0_8_ + 0x28) = start_row;
  pcStack_d0 = ::std::
               _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/local_storage.cpp:156:45)>
               ::_M_invoke;
  local_d8 = ::std::
             _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/local_storage.cpp:156:45)>
             ::_M_manager;
  RowGroupCollection::Scan
            (source,transaction,&required_columns,(function<bool_(duckdb::DataChunk_&)> *)&local_e8)
  ;
  ::std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  DataChunk::~DataChunk(&mock_chunk);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
            (&required_columns.
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&index_columns._M_h);
  return __return_storage_ptr__;
}

Assistant:

ErrorData LocalTableStorage::AppendToIndexes(DuckTransaction &transaction, RowGroupCollection &source,
                                             TableIndexList &index_list, const vector<LogicalType> &table_types,
                                             row_t &start_row) {
	// only need to scan for index append
	// figure out which columns we need to scan for the set of indexes
	auto index_columns = index_list.GetRequiredColumns();
	vector<StorageIndex> required_columns;
	for (auto &col : index_columns) {
		required_columns.emplace_back(col);
	}
	// create an empty mock chunk that contains all the correct types for the table
	DataChunk mock_chunk;
	mock_chunk.InitializeEmpty(table_types);
	ErrorData error;
	source.Scan(transaction, required_columns, [&](DataChunk &chunk) -> bool {
		// construct the mock chunk by referencing the required columns
		for (idx_t i = 0; i < required_columns.size(); i++) {
			auto col_id = required_columns[i].GetPrimaryIndex();
			mock_chunk.data[col_id].Reference(chunk.data[i]);
		}
		mock_chunk.SetCardinality(chunk);
		// append this chunk to the indexes of the table
		error = DataTable::AppendToIndexes(index_list, delete_indexes, mock_chunk, start_row, index_append_mode);
		if (error.HasError()) {
			return false;
		}
		start_row += UnsafeNumericCast<row_t>(chunk.size());
		return true;
	});
	return error;
}